

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMFInterpolater.cpp
# Opt level: O2

void __thiscall
amrex::EBMFCellConsLinInterp::interp
          (EBMFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  int iVar1;
  EBCellFlagFab *this_00;
  uint uVar2;
  bool bVar3;
  int iVar4;
  FabType FVar5;
  FabType FVar6;
  uint uVar7;
  EBFArrayBoxFactory *this_01;
  EBFArrayBoxFactory *this_02;
  FabArray<amrex::EBCellFlagFab> *this_03;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  Box target_fine_region;
  Box result;
  MFIter mfi;
  undefined8 local_258;
  uint uStack_250;
  uint uStack_24c;
  int local_248;
  int local_244;
  FabArray<amrex::EBCellFlagFab> *local_230;
  MFCellConsLinInterp *local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  EBCellFlag *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  double *local_1c0;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  EBCellFlag *local_190;
  long local_188;
  long local_180;
  Array4<const_amrex::EBCellFlag> local_178;
  Array4<double> local_130;
  Array4<const_double> local_f0;
  MFIter local_b0;
  Box local_4c;
  
  local_228 = &this->super_MFCellConsLinInterp;
  MFCellConsLinInterp::interp
            (&this->super_MFCellConsLinInterp,crsemf,ccomp,finemf,fcomp,nc,ng,cgeom,fgeom,
             dest_domain,ratio,bcs,bcomp);
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast((finemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  this_02 = (EBFArrayBoxFactory *)
            __dynamic_cast((crsemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if ((this_02 != (EBFArrayBoxFactory *)0x0 && this_01 != (EBFArrayBoxFactory *)0x0) &&
     (bVar3 = EBFArrayBoxFactory::isAllRegular(this_01), !bVar3)) {
    this_03 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_02);
    local_230 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    MFIter::MFIter(&local_b0,(FabArrayBase *)finemf,'\0');
    uVar14 = (ulong)(uint)nc;
    if (nc < 1) {
      uVar14 = 0;
    }
    local_218 = (long)ccomp;
    local_220 = (long)fcomp;
    while( true ) {
      if (local_b0.endIndex <= local_b0.currentIndex) break;
      MFIter::validbox((Box *)&local_130,&local_b0);
      local_178.kstride._0_4_ = (int)local_130.kstride;
      local_178.kstride._4_4_ = local_130.kstride._4_4_;
      local_178.p = (EBCellFlag *)local_130.p;
      local_178.jstride._0_4_ = (uint)local_130.jstride;
      local_178.jstride._4_4_ = local_130.jstride._4_4_;
      Box::grow((Box *)&local_178,ng);
      local_258 = local_178.p;
      uStack_250 = (uint)local_178.jstride;
      local_244 = local_178.kstride._4_4_;
      uStack_24c = local_178.jstride._4_4_;
      local_248 = (int)local_178.kstride;
      Box::operator&=((Box *)&local_258,dest_domain);
      MFCellConsLinInterp::CoarseBox(&local_4c,local_228,(Box *)&local_258,ratio);
      iVar10 = local_b0.currentIndex;
      if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar10 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_b0.currentIndex];
      }
      if (*(int *)&((crsemf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar10]->super_BaseFab<double>).
                   field_0x44 != 0) {
        iVar4 = local_b0.currentIndex;
        if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar4 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[local_b0.currentIndex];
        }
        this_00 = (this_03->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar10];
        FVar5 = EBCellFlagFab::getType
                          ((local_230->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar4],(Box *)&local_258);
        FVar6 = EBCellFlagFab::getType(this_00,&local_4c);
        if ((FVar5 == multivalued) || (FVar6 == multivalued)) {
          Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
        }
        else if (FVar5 != covered) {
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_178,this_03,&local_b0);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_130,&finemf->super_FabArray<amrex::FArrayBox>,&local_b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_f0,&crsemf->super_FabArray<amrex::FArrayBox>,&local_b0);
          for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
            local_208 = local_218 + uVar8;
            local_210 = local_220 + uVar8;
            for (uVar11 = uStack_250; (int)uVar11 <= local_244; uVar11 = uVar11 + 1) {
              iVar10 = ratio->vect[0];
              iVar4 = ratio->vect[1];
              iVar1 = ratio->vect[2];
              local_190 = local_178.p;
              local_1a0 = (long)local_178.begin.x;
              local_1a8 = (long)local_178.begin.y;
              local_1b0 = (long)local_178.begin.z;
              for (uVar9 = local_258._4_4_; (int)uVar9 <= local_248; uVar9 = uVar9 + 1) {
                if ((int)(uint)local_258 <= (int)uStack_24c) {
                  local_1c0 = local_f0.p;
                  local_1c8 = local_f0.jstride;
                  local_1d0 = (long)local_f0.begin.x;
                  local_1d8 = (long)local_f0.begin.y;
                  local_1e0 = (long)local_f0.begin.z;
                  local_1e8 = local_f0.kstride;
                  local_1f0 = local_f0.nstride * local_208;
                  local_1f8 = (long)local_130.begin.x;
                  local_200 = (EBCellFlag *)
                              ((long)local_130.p +
                              (((long)(int)uVar9 - (long)local_130.begin.y) *
                               CONCAT44(local_130.jstride._4_4_,(uint)local_130.jstride) * 2 +
                              ((long)(int)uVar11 - (long)local_130.begin.z) *
                              CONCAT44(local_130.kstride._4_4_,(int)local_130.kstride) * 2 +
                              CONCAT44(local_130.nstride._4_4_,(undefined4)local_130.nstride) *
                              local_210 * 2) * 4);
                  uVar2 = (uint)local_258;
                  do {
                    uVar12 = uVar2;
                    if (iVar10 != 1) {
                      if (iVar10 == 4) {
                        if ((int)uVar2 < 0) {
                          uVar12 = (int)uVar2 >> 2;
                        }
                        else {
                          uVar12 = uVar2 >> 2;
                        }
                      }
                      else if (iVar10 == 2) {
                        if ((int)uVar2 < 0) {
                          uVar12 = (int)uVar2 >> 1;
                        }
                        else {
                          uVar12 = uVar2 >> 1;
                        }
                      }
                      else if ((int)uVar2 < 0) {
                        uVar12 = ~((int)~uVar2 / iVar10);
                      }
                      else {
                        uVar12 = (int)uVar2 / iVar10;
                      }
                    }
                    uVar13 = uVar9;
                    if (((iVar4 != 1) && (uVar13 = (int)uVar9 >> 2, iVar4 != 4)) &&
                       (uVar13 = (int)uVar9 >> 1, iVar4 != 2)) {
                      if ((int)uVar9 < 0) {
                        uVar13 = ~((int)~uVar9 / iVar4);
                      }
                      else {
                        uVar13 = (int)uVar9 / iVar4;
                      }
                    }
                    uVar7 = uVar11;
                    if (((iVar1 != 1) && (uVar7 = (int)uVar11 >> 2, iVar1 != 4)) &&
                       (uVar7 = (int)uVar11 >> 1, iVar1 != 2)) {
                      if ((int)uVar11 < 0) {
                        uVar7 = ~((int)~uVar11 / iVar1);
                      }
                      else {
                        uVar7 = (int)uVar11 / iVar1;
                      }
                    }
                    local_180 = (long)(int)uVar12;
                    local_188 = (long)(int)uVar13;
                    uVar12 = local_178.p
                             [(local_188 - local_1a8) *
                              CONCAT44(local_178.jstride._4_4_,(uint)local_178.jstride) +
                              (local_180 - local_1a0) +
                              ((int)uVar7 - local_1b0) *
                              CONCAT44(local_178.kstride._4_4_,(int)local_178.kstride)].flag;
                    if (((uVar12 >> 0xf & 1) - ((int)uVar12 >> 0x1f)) +
                        (uint)((uVar12 >> 0x10 & 1) != 0) + (uVar12 >> 0x11 & 1) +
                        (uint)((uVar12 >> 0x13 & 1) != 0) + (uVar12 >> 0x14 & 1) +
                        (uint)((uVar12 >> 0x15 & 1) != 0) + (uVar12 >> 0x16 & 1) +
                        (uint)((uVar12 >> 5 & 1) != 0) + (uVar12 >> 6 & 1) +
                        (uint)((uVar12 >> 7 & 1) != 0) + (uVar12 >> 8 & 1) +
                        (uint)((uVar12 >> 9 & 1) != 0) + (uVar12 >> 10 & 1) +
                        (uint)((uVar12 >> 0xb & 1) != 0) + (uVar12 >> 0xc & 1) +
                        (uint)((uVar12 >> 0xd & 1) != 0) + (uVar12 >> 0x17 & 1) +
                        (uint)((uVar12 >> 0x18 & 1) != 0) + (uVar12 >> 0x19 & 1) +
                        (uint)((uVar12 >> 0x1a & 1) != 0) + (uVar12 >> 0x1b & 1) +
                        (uint)((uVar12 >> 0x1c & 1) != 0) + (uVar12 >> 0x1d & 1) +
                        (uint)((uVar12 >> 0x1e & 1) != 0) + 1 + (uint)((uVar12 >> 0xe & 1) != 0) <
                        0x1b) {
                      *(double *)(local_200 + ((int)uVar2 - local_1f8) * 2) =
                           local_f0.p
                           [(local_188 - local_1d8) * local_f0.jstride +
                            (local_180 - local_1d0) +
                            ((int)uVar7 - local_1e0) * local_f0.kstride + local_1f0];
                    }
                    bVar3 = uVar2 != uStack_24c;
                    uVar2 = uVar2 + 1;
                  } while (bVar3);
                }
              }
            }
          }
        }
      }
      MFIter::operator++(&local_b0);
    }
    MFIter::~MFIter(&local_b0);
  }
  return;
}

Assistant:

void
EBMFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                               IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                               Box const& dest_domain, IntVect const& ratio,
                               Vector<BCRec> const& bcs, int bcomp)
{
    MFCellConsLinInterp::interp(crsemf, ccomp, finemf, fcomp, nc, ng, cgeom, fgeom, dest_domain,
                                ratio, bcs, bcomp);

    auto const ffact = dynamic_cast<EBFArrayBoxFactory const*>(&finemf.Factory());
    auto const cfact = dynamic_cast<EBFArrayBoxFactory const*>(&crsemf.Factory());
    if (!ffact || !cfact || ffact->isAllRegular()) {
        return;
    }

    auto const& cflags = cfact->getMultiEBCellFlagFab();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        auto const& cflg = cflags.const_arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                int ic = amrex::coarsen(i,ratio[0]);
                int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                int kc = k;
#else
                int kc = amrex::coarsen(k,ratio[2]);
#endif
                if (cflg[box_no](ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);
                }
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
        auto const& fflags = ffact->getMultiEBCellFlagFab();
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            Box const target_fine_region = amrex::grow(mfi.validbox(),ng) & dest_domain;
            Box const& crse_bx = CoarseBox(target_fine_region, ratio);
            const EBCellFlagFab& crse_flag_fab = cflags[mfi];
            if (crsemf[mfi].getType() != FabType::regular) {
                const EBCellFlagFab& fine_flag_fab = fflags[mfi];
                const FabType ftype = fine_flag_fab.getType(target_fine_region);
                const FabType ctype = crse_flag_fab.getType(crse_bx);
                if (ftype == FabType::multivalued || ctype == FabType::multivalued)
                {
                    amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
                }
                else if (ftype == FabType::covered)
                {
                    ; // don't need to do anything special
                }
                else
                {
                    const auto& crse_flag = cflags.const_array(mfi);
                    const auto& fine = finemf.array(mfi);
                    const auto& crse = crsemf.const_array(mfi);
                    amrex::LoopConcurrentOnCpu(target_fine_region, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        int ic = amrex::coarsen(i,ratio[0]);
                        int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                        int kc = k;
#else
                        int kc = amrex::coarsen(k,ratio[2]);
#endif
                        if (crse_flag(ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                            fine(i,j,k,n+fcomp) = crse(ic,jc,kc,n+ccomp);
                        }
                    });
                }
            }
        }
    }
}